

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_template.h
# Opt level: O2

void helper_atomic_sto_be_mmu_m68k
               (CPUArchState_conflict3 *env,target_ulong_conflict addr,Int128 val,TCGMemOpIdx oi,
               uintptr_t retaddr)

{
  Int128 *ptr;
  TCGMemOpIdx in_R8D;
  uintptr_t in_R9;
  
  ptr = (Int128 *)atomic_mmu_lookup(env,addr,in_R8D,in_R9);
  atomic16_set(ptr,val);
  return;
}

Assistant:

void ATOMIC_NAME(st)(CPUArchState *env, target_ulong addr,
                     ABI_TYPE val EXTRA_ARGS)
{
    ATOMIC_MMU_DECLS;
    DATA_TYPE *haddr = ATOMIC_MMU_LOOKUP;

    val = BSWAP(val);
    val = BSWAP(val);
    atomic16_set(haddr, val);
    ATOMIC_MMU_CLEANUP;
}